

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O3

bool __thiscall CGlyphMap::SetFaceByName(CGlyphMap *this,FT_Face_conflict *pFace,char *pFamilyName)

{
  bool bVar1;
  int iVar2;
  FT_Face_conflict pFVar3;
  long lVar4;
  long in_FS_OFFSET;
  char aFamilyStyleName [128];
  char local_b8 [128];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((pFamilyName != (char *)0x0) && (0 < this->m_NumFtFaces)) {
    lVar4 = 0;
    pFVar3 = (FT_Face_conflict)0x0;
    do {
      str_format(local_b8,0x80,"%s %s",this->m_aFtFaces[lVar4]->family_name,
                 this->m_aFtFaces[lVar4]->style_name);
      iVar2 = str_comp(pFamilyName,local_b8);
      if (iVar2 == 0) {
        pFVar3 = this->m_aFtFaces[lVar4];
        break;
      }
      if (pFVar3 == (FT_Face_conflict)0x0) {
        iVar2 = str_comp(pFamilyName,this->m_aFtFaces[lVar4]->family_name);
        if (iVar2 == 0) {
          pFVar3 = this->m_aFtFaces[lVar4];
        }
        else {
          pFVar3 = (FT_Face_conflict)0x0;
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->m_NumFtFaces);
    if (pFVar3 != (FT_Face_conflict)0x0) {
      *pFace = pFVar3;
      bVar1 = true;
      goto LAB_0012fafb;
    }
  }
  bVar1 = false;
LAB_0012fafb:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool CGlyphMap::SetFaceByName(FT_Face *pFace, const char *pFamilyName)
{
	FT_Face Face = NULL;
	char aFamilyStyleName[FONT_NAME_SIZE];

	if(pFamilyName != NULL)
	{
		for(int i = 0; i < m_NumFtFaces; ++i)
		{
			str_format(aFamilyStyleName, FONT_NAME_SIZE, "%s %s", m_aFtFaces[i]->family_name, m_aFtFaces[i]->style_name);
			if(str_comp(pFamilyName, aFamilyStyleName) == 0)
			{
				Face = m_aFtFaces[i];
				break;
			}

			if(!Face && str_comp(pFamilyName, m_aFtFaces[i]->family_name) == 0)
			{
				Face = m_aFtFaces[i];
			}
		}
	}

	if(Face)
	{
		*pFace = Face;
		return true;
	}
	return false;
}